

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

int64_t __thiscall rcg::Device::getModuleEvent(Device *this,int64_t _timeout)

{
  mutex *__mutex;
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  pointer puVar1;
  element_type *peVar2;
  GC_ERROR GVar3;
  int iVar4;
  CPort *this_00;
  undefined8 extraout_RAX;
  CEventAdapterGeneric *this_01;
  GenTLException *pGVar5;
  size_t i;
  ulong uVar6;
  uint64_t uVar7;
  allocator local_e5;
  undefined4 local_e4;
  size_t size;
  INFO_DATATYPE type_1;
  __shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *local_d0;
  size_t size_1;
  size_t value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0 [9];
  size_t tmp_size;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  uVar7 = 0xffffffffffffffff;
  if (_timeout < 0) {
    _timeout = uVar7;
  }
  if (this->event == (EVENT_HANDLE)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    uVar7 = 0xfffffffffffffffd;
  }
  else {
    if ((this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      value = 0;
      size_1 = 8;
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                EventGetInfo)(this->event,3,(INFO_DATATYPE *)&size,&value,&size_1);
      if (GVar3 == 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->event_buffer,value);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->event_value,value)
        ;
      }
    }
    for (uVar6 = 0;
        puVar1 = (this->event_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->event_buffer).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
        uVar6 = uVar6 + 1) {
      puVar1[uVar6] = '\0';
      (this->event_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = '\0';
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    puVar1 = (this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    size = (long)(this->event_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar1;
    gentl = &this->gentl;
    GVar3 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->EventGetData)(this->event,puVar1,&size,_timeout);
    std::mutex::lock(__mutex);
    if (GVar3 == 0) {
      type_1 = 0;
      tmp_size = 0x50;
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                EventGetDataInfo)(this->event,
                                  (this->event_buffer).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,size,0,&type_1,&value,
                                  &tmp_size);
      if (GVar3 != 0) {
        pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&size_1,"Device::getModuleEvent()",&local_e5);
        GenTLException::GenTLException(pGVar5,(string *)&size_1,gentl);
        __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      if (type_1 == 5) {
        uVar7 = (uint64_t)(int)value;
      }
      else if (type_1 == 1) {
        std::__cxx11::string::string((string *)&size_1,(char *)&value,&local_e5);
        iVar4 = std::__cxx11::stoi((string *)&size_1,(size_t *)0x0,0x10);
        uVar7 = (uint64_t)iVar4;
        std::__cxx11::string::~string((string *)&size_1);
      }
      else {
        uVar7 = 0xffffffffffffffff;
      }
      size_1 = size_1 & 0xffffffff00000000;
      puVar1 = (this->event_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      size = (long)(this->event_value).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1;
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                EventGetDataInfo)(this->event,
                                  (this->event_buffer).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,size,1,
                                  (INFO_DATATYPE *)&size_1,puVar1,&size);
      if (GVar3 != 0) {
        pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&value,"Device::getModuleEvent()",(allocator *)&tmp_size);
        GenTLException::GenTLException(pGVar5,(string *)&value,gentl);
        __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      local_d0 = &(this->nodemap).
                  super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
      if ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        this_00 = (CPort *)operator_new(0x20);
        std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   &gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>);
        local_e4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        CPort::CPort(this_00,(shared_ptr<const_rcg::GenTLWrapper> *)&local_40,&this->dev);
        local_e4 = 0;
        std::__shared_ptr<rcg::CPort,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::CPort,void>
                  ((__shared_ptr<rcg::CPort,(__gnu_cxx::_Lock_policy)2> *)&value,this_00);
        std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *)&value);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,
                   &gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>);
        allocNodeMap((rcg *)&value,(shared_ptr<const_rcg::GenTLWrapper> *)&local_50,this->dev,
                     (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,(char *)0x0);
        std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_d0,(__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)
                            &value);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      }
      if ((this->eventadapter).
          super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        this_01 = (CEventAdapterGeneric *)operator_new(0x20);
        GenApi_3_4::CEventAdapterGeneric::CEventAdapterGeneric
                  (this_01,(((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)
                            &local_d0->_M_ptr)->_M_ptr->
                           super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr);
        std::__shared_ptr<GenApi_3_4::CEventAdapterGeneric,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<GenApi_3_4::CEventAdapterGeneric,void>
                  ((__shared_ptr<GenApi_3_4::CEventAdapterGeneric,(__gnu_cxx::_Lock_policy)2> *)
                   &value,this_01);
        std::__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->eventadapter).
                    super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ,(__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2> *)
                    &value);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
      }
      if (0 < (long)uVar7) {
        peVar2 = (this->eventadapter).
                 super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (**(code **)(*(long *)peVar2 + 0x30))
                  (peVar2,(this->event_value).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,size & 0xffffffff,uVar7);
      }
    }
    else if (GVar3 != -0x3f3) {
      if (GVar3 != -0x3f4) {
        pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&value,"Device::getModuleEvent()",(allocator *)&size_1);
        GenTLException::GenTLException(pGVar5,(string *)&value,gentl);
        __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      uVar7 = 0xfffffffffffffffe;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return uVar7;
}

Assistant:

int64_t Device::getModuleEvent(int64_t _timeout)
{
  int64_t eventid=-1;
  uint64_t timeout=GENTL_INFINITE;

  {
    std::lock_guard<std::mutex> lock(mtx);

    if (_timeout >= 0)
    {
      timeout=static_cast<uint64_t>(_timeout);
    }

    // check that streaming had been started

    if (event == 0)
    {
      return -3;
    }

    // determine memory for receiving the event

    if (event_buffer.size() == 0)
    {
      size_t value=0;

      GenTL::INFO_DATATYPE type;
      size_t size=sizeof(value);

      if (gentl->EventGetInfo(event, GenTL::EVENT_SIZE_MAX, &type, &value, &size) == GenTL::GC_ERR_SUCCESS)
      {
        event_buffer.resize(value);
        event_value.resize(value);
      }
    }

    // clear buffer

    for (size_t i=0; i<event_buffer.size(); i++)
    {
      event_buffer[i]=0;
      event_value[i]=0;
    }
  }

  // get event data

  size_t size=event_buffer.size();

  GenTL::GC_ERROR err=gentl->EventGetData(event, event_buffer.data(), &size, timeout);

  std::lock_guard<std::mutex> lock(mtx);

  // return 0 in case of abort and timeout and throw exception in case of
  // another error

  if (err == GenTL::GC_ERR_TIMEOUT)
  {
    return -1;
  }
  else if (err == GenTL::GC_ERR_ABORT)
  {
    return -2;
  }
  else if (err != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("Device::getModuleEvent()", gentl);
  }

  // get event ID

  {
    GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
    char tmp[80];
    size_t tmp_size=sizeof(tmp);

    err=gentl->EventGetDataInfo(event, event_buffer.data(), size, GenTL::EVENT_DATA_ID,
      &type, tmp, &tmp_size);

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getModuleEvent()", gentl);
    }

    if (type == GenTL::INFO_DATATYPE_STRING)
    {
      eventid=std::stoi(std::string(tmp), 0, 16);
    }
    else if (type == GenTL::INFO_DATATYPE_INT32)
    {
      int32_t value=0;
      memcpy(&value, tmp, sizeof(value));
      eventid=value;
    }
  }

  // get event value

  {
    GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
    size=event_value.size();

    err=gentl->EventGetDataInfo(event, event_buffer.data(), size, GenTL::EVENT_DATA_VALUE,
      &type, event_value.data(), &size);

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getModuleEvent()", gentl);
    }
  }

  if (!nodemap)
  {
    cport=std::shared_ptr<CPort>(new CPort(gentl, &dev));
    nodemap=allocNodeMap(gentl, dev, cport.get(), 0);
  }

  try
  {
    if (!eventadapter)
    {
      eventadapter=std::shared_ptr<GenApi::CEventAdapterGeneric>(new GenApi::CEventAdapterGeneric(nodemap->_Ptr));
    }

    if (eventid > 0)
    {
      eventadapter->DeliverMessage(event_value.data(), size, static_cast<uint64_t>(eventid));
    }
  }
  catch (const std::exception &)
  { }

  return eventid;
}